

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void setarrayvector(lua_State *L,Table *t,int size)

{
  TValue *pTVar1;
  int *piVar2;
  long lVar3;
  
  if (-2 < size) {
    pTVar1 = (TValue *)luaM_realloc_(L,t->array,(long)t->sizearray << 4,(long)size << 4);
    t->array = pTVar1;
    lVar3 = (long)t->sizearray;
    piVar2 = &pTVar1[lVar3].tt;
    for (; lVar3 < size; lVar3 = lVar3 + 1) {
      *piVar2 = 0;
      piVar2 = piVar2 + 4;
    }
    t->sizearray = size;
    return;
  }
  luaM_toobig(L);
}

Assistant:

static void setarrayvector(lua_State*L,Table*t,int size){
int i;
luaM_reallocvector(L,t->array,t->sizearray,size,TValue);
for(i=t->sizearray;i<size;i++)
setnilvalue(&t->array[i]);
t->sizearray=size;
}